

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vertex.h
# Opt level: O1

Vertex * Assimp::Vertex::BinaryOp<Assimp::Intern::multiplies>
                   (Vertex *__return_storage_ptr__,Vertex *v0,ai_real f)

{
  float *pfVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  long lVar5;
  
  lVar5 = 0;
  memset(__return_storage_ptr__,0,0x110);
  fVar2 = (v0->position).y;
  fVar3 = (v0->position).z;
  (__return_storage_ptr__->position).x = (v0->position).x * f;
  (__return_storage_ptr__->position).y = fVar2 * f;
  (__return_storage_ptr__->position).z = fVar3 * f;
  fVar2 = (v0->normal).y;
  fVar3 = (v0->normal).z;
  (__return_storage_ptr__->normal).x = (v0->normal).x * f;
  (__return_storage_ptr__->normal).y = fVar2 * f;
  (__return_storage_ptr__->normal).z = fVar3 * f;
  fVar2 = (v0->tangent).y;
  fVar3 = (v0->tangent).z;
  (__return_storage_ptr__->tangent).x = (v0->tangent).x * f;
  (__return_storage_ptr__->tangent).y = fVar2 * f;
  (__return_storage_ptr__->tangent).z = fVar3 * f;
  fVar2 = (v0->bitangent).y;
  fVar3 = (v0->bitangent).z;
  (__return_storage_ptr__->bitangent).x = (v0->bitangent).x * f;
  (__return_storage_ptr__->bitangent).y = fVar2 * f;
  (__return_storage_ptr__->bitangent).z = fVar3 * f;
  do {
    fVar2 = *(float *)((long)&v0->texcoords[0].z + lVar5);
    *(ulong *)((long)&__return_storage_ptr__->texcoords[0].x + lVar5) =
         CONCAT44(*(float *)((long)&v0->texcoords[0].y + lVar5) * f,
                  *(float *)((long)&v0->texcoords[0].x + lVar5) * f);
    *(float *)((long)&__return_storage_ptr__->texcoords[0].z + lVar5) = fVar2 * f;
    lVar5 = lVar5 + 0xc;
  } while (lVar5 != 0x60);
  lVar5 = 0;
  do {
    fVar2 = *(float *)((long)&v0->colors[0].g + lVar5);
    fVar3 = *(float *)((long)&v0->colors[0].b + lVar5);
    fVar4 = *(float *)((long)&v0->colors[0].a + lVar5);
    pfVar1 = (float *)((long)&__return_storage_ptr__->colors[0].r + lVar5);
    *pfVar1 = *(float *)((long)&v0->colors[0].r + lVar5) * f;
    pfVar1[1] = fVar2 * f;
    pfVar1[2] = fVar3 * f;
    pfVar1[3] = fVar4 * f;
    lVar5 = lVar5 + 0x10;
  } while (lVar5 != 0x80);
  return __return_storage_ptr__;
}

Assistant:

static Vertex BinaryOp(const Vertex& v0, ai_real f) {
        // this is a heavy task for the compiler to optimize ... *pray*

        Vertex res;
        res.position  = op<aiVector3D,ai_real,aiVector3D>()(v0.position,f);
        res.normal    = op<aiVector3D,ai_real,aiVector3D>()(v0.normal,f);
        res.tangent   = op<aiVector3D,ai_real,aiVector3D>()(v0.tangent,f);
        res.bitangent = op<aiVector3D,ai_real,aiVector3D>()(v0.bitangent,f);

        for (unsigned int i = 0; i < AI_MAX_NUMBER_OF_TEXTURECOORDS; ++i) {
            res.texcoords[i] = op<aiVector3D,ai_real,aiVector3D>()(v0.texcoords[i],f);
        }
        for (unsigned int i = 0; i < AI_MAX_NUMBER_OF_COLOR_SETS; ++i) {
            res.colors[i] = op<aiColor4D,ai_real,aiColor4D>()(v0.colors[i],f);
        }
        return res;
    }